

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

void __thiscall google::protobuf::MessageLite::LogInitializationErrorMessage(MessageLite *this)

{
  LogMessage *other;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  LogMessage local_50;
  
  internal::LogMessage::LogMessage
            (&local_50,LOGLEVEL_DFATAL,
             "third_party/sentencepiece/third_party/protobuf-lite/message_lite.cc",0x85);
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::append((char *)&local_70);
  std::__cxx11::string::append((char *)&local_70);
  std::__cxx11::string::append((char *)&local_70);
  (*this->_vptr_MessageLite[2])(local_90,this);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90[0]);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  std::__cxx11::string::append((char *)&local_70);
  (*this->_vptr_MessageLite[7])(local_90,this);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90[0]);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  other = internal::LogMessage::operator<<(&local_50,&local_70);
  internal::LogFinisher::operator=((LogFinisher *)local_90,other);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  internal::LogMessage::~LogMessage(&local_50);
  return;
}

Assistant:

void MessageLite::LogInitializationErrorMessage() const {
  GOOGLE_LOG(ERROR) << InitializationErrorMessage("parse", *this);
}